

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

Move * ddSiftingDown(DdManager *table,int x,int xHigh)

{
  int x_00;
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  Move *pMVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  int iVar10;
  DdHalfWord y;
  long local_50;
  int local_48;
  
  lVar5 = (long)x;
  x_00 = table->invperm[lVar5];
  local_48 = table->keys - table->isolated;
  iVar10 = 0;
  if (x < xHigh) {
    lVar7 = (long)xHigh;
    lVar6 = lVar7 * 0xe + 4;
    iVar10 = 0;
    do {
      iVar2 = table->invperm[lVar7];
      iVar1 = cuddTestInteract(table,x_00,iVar2);
      if (iVar1 != 0) {
        iVar10 = (iVar10 - (uint)(table->vars[iVar2]->ref == 1)) +
                 *(int *)((long)&table->subtables->nodelist + lVar6 * 4);
      }
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + -0xe;
    } while (lVar5 < lVar7);
  }
  pMVar4 = (Move *)0x0;
  if ((x < xHigh) && (0 < iVar10)) {
    local_50 = lVar5 * 0xe + 0x12;
    pDVar8 = (DdNode *)0x0;
    while( true ) {
      lVar5 = lVar5 + 1;
      iVar2 = table->invperm[lVar5];
      iVar1 = cuddTestInteract(table,x_00,iVar2);
      if (iVar1 != 0) {
        iVar10 = (iVar10 + (uint)(table->vars[iVar2]->ref == 1)) -
                 *(int *)((long)&table->subtables->nodelist + local_50 * 4);
      }
      y = x + 1;
      iVar2 = cuddSwapInPlace(table,x,y);
      if ((iVar2 == 0) || (pDVar3 = cuddDynamicAllocNode(table), pDVar3 == (DdNode *)0x0)) break;
      pDVar3->index = x;
      pDVar3->ref = y;
      *(int *)((long)&pDVar3->next + 4) = iVar2;
      (pDVar3->type).kids.T = pDVar8;
      if ((double)local_48 * table->maxGrowth < (double)iVar2) {
        return (Move *)pDVar3;
      }
      if (iVar2 < local_48) {
        local_48 = iVar2;
      }
      if (xHigh <= lVar5) {
        return (Move *)pDVar3;
      }
      local_50 = local_50 + 0xe;
      pDVar8 = pDVar3;
      x = y;
      if (local_48 <= iVar2 - iVar10) {
        return (Move *)pDVar3;
      }
    }
    pMVar4 = (Move *)0xffffffffffffffff;
    if (pDVar8 != (DdNode *)0x0) {
      pDVar3 = table->nextFree;
      do {
        pDVar9 = pDVar8;
        pDVar8 = (pDVar9->type).kids.T;
        pDVar9->ref = 0;
        pDVar9->next = pDVar3;
        pDVar3 = pDVar9;
      } while (pDVar8 != (DdNode *)0x0);
      table->nextFree = pDVar9;
    }
  }
  return pMVar4;
}

Assistant:

static Move *
ddSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         R;      /* upper bound on node decrease */
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
#ifdef DD_DEBUG
    int         checkR;
    int         z;
    int         zindex;
#endif

    moves = NULL;
    /* Initialize R */
    xindex = table->invperm[x];
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (y = xHigh; y > x; y--) {
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R += table->subtables[y].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        checkR = 0;
        for (z = xHigh; z > x; z--) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R == checkR);
#endif
        /* Update upper bound on node decrease. */
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R -= table->subtables[y].keys - isolated;
        }
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddSiftingDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddSiftingDownOutOfMem;
        move->x = x;
        move->y = y;
        move->size = size;
        move->next = moves;
        moves = move;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        x = y;
        y = cuddNextHigh(table,x);
    }
    return(moves);

ddSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}